

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringFormat.h
# Opt level: O2

void doFormatString<unsigned_long_const,int>
               (wstringstream *stream,wchar_t *format,unsigned_long *first,int *rest)

{
  wchar_t wVar1;
  bool bVar2;
  wchar_t *local_30;
  
  while( true ) {
    wVar1 = *format;
    if (wVar1 == L'\0') {
      return;
    }
    if (wVar1 == L'%') break;
    std::operator<<((wostream *)(stream + 0x10),wVar1);
    format = format + 1;
  }
  local_30 = format + 1;
  bVar2 = doFormatSetup(stream,&local_30);
  if (bVar2) {
    std::wostream::_M_insert<unsigned_long>((ulong)(stream + 0x10));
  }
  doFormatString<int_const>(stream,local_30,rest);
  return;
}

Assistant:

void doFormatString(std::wstringstream& stream, const wchar_t* format, First& first, const Rest&... rest)
{
	while (*format != 0)
	{
		if (*format == '%')
		{
			format++;
			if (doFormatSetup(stream,format))
				stream << first;
			doFormatString(stream,format,rest...);
			return;
		}

		stream << *format++;
	}
}